

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

Var Js::JavascriptString::EntryRepeat(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint32 count;
  undefined4 *puVar4;
  Var pvVar5;
  Var instance;
  ScriptContext *pSVar6;
  int in_stack_00000010;
  JavascriptString *local_60;
  JavascriptString *pThis;
  undefined1 local_50 [8];
  ArgumentReader args;
  CallInfo local_38;
  CallInfo callInfo_local;
  
  pSVar6 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_38 = callInfo;
  ThreadContext::ProbeStack(pSVar6->threadContext,0xc00,pSVar6,(PVOID)0x0);
  if (in_stack_00000010 != local_38._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xa03,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00d28a15;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_50 = (undefined1  [8])local_38;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_50,&local_38);
  if (((ulong)local_50 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xa04,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar2) goto LAB_00d28a15;
    *puVar4 = 0;
  }
  pSVar6 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_38 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xa07,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) goto LAB_00d28a15;
    *puVar4 = 0;
  }
  local_60 = (JavascriptString *)0x0;
  GetThisStringArgument((ArgumentReader *)local_50,pSVar6,L"String.prototype.repeat",&local_60);
  count = 0;
  if (((ulong)local_50 & 0xfffffe) == 0) goto LAB_00d289d8;
  args.super_Arguments.Values = (Type)pSVar6;
  pvVar5 = Arguments::operator[]((Arguments *)local_50,1);
  if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00d28a15;
    *puVar4 = 0;
  }
  instance = Arguments::operator[]((Arguments *)local_50,1);
  if (((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
    if (((ulong)instance & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)instance & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00d28a15;
      *puVar4 = 0;
    }
    pSVar6 = (ScriptContext *)args.super_Arguments.Values;
    if (((ulong)instance & 0xffff000000000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar2) {
LAB_00d28a15:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    count = (uint32)instance;
    if (-1 < (int)count) {
LAB_00d289d8:
      if ((count == 0) || (local_60->m_charLength == 0)) {
        local_60 = JavascriptLibrary::GetEmptyString
                             ((pSVar6->super_ScriptContextBase).javascriptLibrary);
      }
      else if (count != 1) {
        local_60 = RepeatCore(local_60,count,pSVar6);
      }
      return local_60;
    }
  }
  else {
    BVar3 = JavascriptOperators::IsUndefinedObject(instance);
    pSVar6 = (ScriptContext *)args.super_Arguments.Values;
    if (BVar3 != 0) goto LAB_00d289d8;
    pvVar5 = Arguments::operator[]((Arguments *)local_50,1);
    pThis = (JavascriptString *)JavascriptConversion::ToInteger_Full(pvVar5,pSVar6);
    bVar2 = NumberUtilities::IsSpecial((double)pThis,0x7ff0000000000000);
    if ((!bVar2) && (0.0 <= (double)pThis)) {
      count = NumberUtilities::LuFromDblNearest((double)pThis);
      goto LAB_00d289d8;
    }
  }
  JavascriptError::ThrowRangeError(pSVar6,-0x7ff5ebf6,L"String.prototype.repeat");
}

Assistant:

Var JavascriptString::EntryRepeat(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(String_Prototype_repeat);

        JavascriptString* pThis = nullptr;
        GetThisStringArgument(args, scriptContext, _u("String.prototype.repeat"), &pThis);

        charcount_t count = 0;

        if (args.Info.Count > 1)
        {
            if (TaggedInt::Is(args[1]))
            {
                int32 signedCount = TaggedInt::ToInt32(args[1]);
                if (signedCount < 0)
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("String.prototype.repeat"));
                }
                count = (uint32) signedCount;
            }
            else if (!JavascriptOperators::IsUndefinedObject(args[1]))
            {
                double countDbl = JavascriptConversion::ToInteger_Full(args[1], scriptContext);
                if (JavascriptNumber::IsPosInf(countDbl) || countDbl < 0.0)
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("String.prototype.repeat"));
                }

                count = NumberUtilities::LuFromDblNearest(countDbl);
            }
        }

        if (count == 0 || pThis->GetLength() == 0)
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }
        else if (count == 1)
        {
            return pThis;
        }

        return RepeatCore(pThis, count, scriptContext);
    }